

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O2

uint8_t __thiscall
GmmLib::PageTable::GetMappingType
          (PageTable *this,GMM_GFX_ADDRESS GfxVA,GMM_GFX_SIZE_T Size,GMM_GFX_ADDRESS *LastAddr)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  LastLevelTable *pLVar3;
  undefined4 extraout_var_03;
  ulong uVar4;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ulong uVar5;
  undefined4 extraout_var_08;
  ushort uVar6;
  uint uVar7;
  uint uVar8;
  uint8_t uVar9;
  ulong uVar10;
  uint32_t NumTiles;
  GMM_GFX_ADDRESS GVar11;
  bool bVar12;
  ulong uVar13;
  bool bVar14;
  uint local_a0;
  uint local_90;
  long local_48;
  ulong local_40;
  GMM_GFX_SIZE_T local_38;
  
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  uVar6 = 1;
  if ((*(byte *)(CONCAT44(extraout_var,iVar2) + 0x45) & 0x40) == 0) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    uVar6 = 4;
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 0x45) & 0x80) == 0) {
      uVar6 = 0x40;
    }
  }
  local_40 = (ulong)(ushort)(((uint)(GfxVA >> 0xe) & 0x3ff) / (uint)uVar6);
  iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  local_48 = 0x4000;
  if ((*(byte *)(CONCAT44(extraout_var_01,iVar2) + 0x45) & 0x40) == 0) {
    iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    local_48 = 0x10000;
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0x45) & 0x80) == 0) {
      local_48 = 0x100000;
    }
  }
  uVar13 = GfxVA >> 0x24 & 0xfff;
  local_38 = GfxVA >> 0x18 & 0xfff;
  pthread_mutex_lock((pthread_mutex_t *)&this->TTLock);
  uVar5 = 0;
  bVar12 = false;
  bVar14 = false;
  GVar11 = GfxVA;
LAB_001c4625:
  do {
    uVar9 = (uint8_t)uVar5;
    if (bVar12) {
LAB_001c4967:
      pthread_mutex_unlock((pthread_mutex_t *)&this->TTLock);
      return uVar9;
    }
    if (bVar14 || Size + GfxVA <= GVar11) {
      *LastAddr = GVar11;
      goto LAB_001c4967;
    }
    if (this->pTTL2[uVar13].super_Table.PoolElem == (GMM_PAGETABLEPool *)0x0) {
      if (uVar9 == '\0') {
        iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        uVar8 = *(uint *)(CONCAT44(extraout_var_06,iVar2) + 0x44);
        if (GVar11 == GfxVA) {
          uVar6 = 1;
          if ((uVar8 >> 0xe & 1) == 0) {
            iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar6 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_07,iVar2) + 0x45) & 0x80) == 0) {
              uVar6 = 0x40;
            }
          }
          uVar5 = (ulong)(0x1000 - (int)local_38) * (ulong)(0x400 / uVar6 - (uint)local_40);
        }
        else {
          uVar6 = 1;
          if ((uVar8 >> 0xe & 1) == 0) {
            iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar6 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_08,iVar2) + 0x45) & 0x80) == 0) {
              uVar6 = 0x40;
            }
          }
          uVar5 = (ulong)(0x400 / uVar6 << 0xc);
        }
        GVar11 = GVar11 + uVar5 * local_48;
        uVar13 = uVar13 + 1;
        bVar14 = uVar13 == 0x1000;
        local_40 = 0;
        uVar5 = 0;
        local_38 = 0;
      }
      else {
        *LastAddr = GVar11;
        uVar5 = 1;
        bVar14 = false;
        bVar12 = true;
      }
    }
    else {
      pLVar3 = MidLevelTable::GetL1Table(this->pTTL2 + uVar13,local_38,(LastLevelTable **)0x0);
      if ((pLVar3 == (LastLevelTable *)0x0) ||
         ((pLVar3->super_Table).PoolElem == (GMM_PAGETABLEPool *)0x0)) {
        if (uVar9 == '\0') {
          iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar6 = 1;
          if ((*(byte *)(CONCAT44(extraout_var_04,iVar2) + 0x45) & 0x40) == 0) {
            iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar6 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_05,iVar2) + 0x45) & 0x80) == 0) {
              uVar6 = 0x40;
            }
          }
          uVar5 = 0;
          if (GVar11 != GfxVA) {
            local_40 = uVar5;
          }
          GVar11 = GVar11 + (0x400 / uVar6 - local_40) * local_48;
          local_38 = local_38 + 1;
          local_40 = 0;
          bVar14 = false;
          if (local_38 == 0x1000) {
            uVar13 = uVar13 + 1;
            bVar14 = uVar13 == 0x1000;
            local_40 = 0;
            uVar5 = 0;
            local_38 = 0;
          }
        }
        else {
          *LastAddr = GVar11;
          uVar5 = 1;
          bVar14 = false;
          bVar12 = true;
        }
      }
      else {
        uVar8 = (uint)local_40 & 0x1f;
        uVar10 = local_40 >> 5;
        while (!bVar12) {
          iVar2 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar4 = 8;
          if ((*(byte *)(CONCAT44(extraout_var_03,iVar2) + 0x45) & 0x40) != 0) {
            uVar4 = 0x20;
          }
          if (uVar4 <= uVar10) {
            local_38 = local_38 + 1;
            local_40 = 0;
            bVar14 = false;
            if (local_38 == 0x1000) {
              uVar13 = uVar13 + 1;
              bVar14 = uVar13 == 0x1000;
              local_40 = 0;
              local_38 = 0;
            }
            goto LAB_001c4625;
          }
          uVar1 = (pLVar3->super_Table).UsedEntries[uVar10];
          if (GVar11 == GfxVA) {
            local_a0 = (uint)(1L << ((byte)local_40 & 0x1f));
            bVar14 = (local_a0 & uVar1) != 0;
            uVar5 = (ulong)bVar14;
            local_90 = (uint)(-1L << (char)uVar8 + 1);
            local_90 = (-(uint)bVar14 ^ uVar1) & local_90;
            uVar4 = (ulong)(0x20 - uVar8);
            uVar7 = uVar8;
          }
          else {
            uVar7 = 0;
            local_90 = -(uint)((char)uVar5 != '\0') ^ uVar1;
            uVar4 = 0x20;
          }
          if (local_90 == 0) {
            GVar11 = GVar11 + uVar4 * local_48;
            uVar10 = uVar10 + 1;
          }
          else {
            iVar2 = 0;
            if (local_90 != 0) {
              for (; (local_90 >> iVar2 & 1) == 0; iVar2 = iVar2 + 1) {
              }
            }
            *LastAddr = (ulong)(iVar2 - uVar7) * local_48 + GVar11;
            uVar10 = uVar10 + 1;
            bVar12 = true;
          }
        }
        bVar14 = false;
      }
    }
  } while( true );
}

Assistant:

uint8_t GmmLib::PageTable::GetMappingType(GMM_GFX_ADDRESS GfxVA, GMM_GFX_SIZE_T Size, GMM_GFX_ADDRESS &LastAddr)
{
    GMM_GFX_SIZE_T  L3eIdx, L2eIdx, L1eIdx, L1EntrySize;
    uint32_t        L1Size, L2Size;
    uint8_t         MapType      = 0; //true for non-null, false for null mapped
    bool            bFoundLastVA = false, bTerminate = false;
    GMM_GFX_ADDRESS TileAddr = GfxVA;

    L3eIdx      = GMM_L3_ENTRY_IDX(TTType, GfxVA);
    L2eIdx      = GMM_L2_ENTRY_IDX(TTType, GfxVA);
    L1eIdx      = GMM_L1_ENTRY_IDX(TTType, GfxVA, GetGmmLibContext());
    L1EntrySize = WA16K(GetGmmLibContext()) ? GMM_KBYTE(16) : WA64K(GetGmmLibContext()) ? GMM_KBYTE(64) : GMM_MBYTE(1);

    EnterCriticalSection(&TTLock);
    __GMM_ASSERT(TTL3.L3Handle);

#define GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = 0;                              \
        L2eIdx++;                                \
        if(L2eIdx == (GMM_L2_SIZE(TTType)))      \
        {                                        \
            L2eIdx = 0;                          \
            L3eIdx++;                            \
            if(L3eIdx == (GMM_L3_SIZE(TTType)))  \
            {                                    \
                bTerminate = true;               \
            }                                    \
        }                                        \
    }

#define GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = L2eIdx = 0;                     \
        L3eIdx++;                                \
        if(L3eIdx == (GMM_L3_SIZE(TTType)))      \
        {                                        \
            bTerminate = true;                   \
        }                                        \
    }

    while(!(bFoundLastVA || bTerminate) && (TileAddr < GfxVA + Size))
    {
        if(pTTL2[L3eIdx].GetPool())
        {
            GmmLib::LastLevelTable *pL1Tbl = NULL;
            pL1Tbl                         = pTTL2[L3eIdx].GetL1Table(L2eIdx);
            if(pL1Tbl && pL1Tbl->GetPool())
            {
                uint32_t LastBit = 0;
                uint32_t i       = static_cast<uint32_t>(L1eIdx) / 32;

                while(!bFoundLastVA && i < (uint32_t)(GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext())))
                {
                    uint32_t UsageDW = pL1Tbl->GetUsedEntries()[i++];
                    uint32_t BitNum  = 31;
                    if(GfxVA == TileAddr)
                    {
                        BitNum  = L1eIdx % 32;
                        MapType = ((UsageDW & __BIT(BitNum)) ? 0x1 : 0x0); //true for non-null, false for null mapped
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                        UsageDW = ((uint64_t)UsageDW >> (BitNum + 1)) << (BitNum + 1); // clear lsb <= BitNum
                    }
                    else
                    {
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                    }

                    if(_BitScanForward((uint32_t *)&LastBit, UsageDW)) // Gets lsb > BitNum, having reverse mapType
                    {
                        bFoundLastVA      = true;
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (LastBit - BitNum) : LastBit;
                        LastAddr          = TileAddr + NumTiles * L1EntrySize;
                    }
                    else
                    {
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (32 - BitNum) : 32;
                        TileAddr += NumTiles * L1EntrySize;
                    }
                }
                if(!bFoundLastVA)
                {
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx);
                }
            }
            else //L2Entry is NULL
            {
                if(MapType) //First hit null-map
                {
                    LastAddr     = TileAddr;
                    bFoundLastVA = true;
                }
                else
                {
                    GMM_GFX_SIZE_T NumTiles = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());			
                    if(GfxVA == TileAddr)
                    {
                        MapType = false;
                        NumTiles -= L1eIdx;
                    }
                    TileAddr += NumTiles * L1EntrySize;
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx)
                }
            }
        }
        else //L3entry is NULL
        {
            if(MapType) //First hit null-map
            {
                LastAddr     = TileAddr;
                bFoundLastVA = true;
            }
            else
            {
                GMM_GFX_SIZE_T NumTiles = 0;
                if(GfxVA == TileAddr)
                {
                    MapType  = false;
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext()) - L1eIdx;
                    L2Size   = GMM_L2_SIZE(TTType) - L2eIdx;
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                else
                {
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());
                    L2Size   = GMM_L2_SIZE(TTType);
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                TileAddr += NumTiles * L1EntrySize;
                GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx)
            }
        }
    }

    if(!bFoundLastVA)
    {
        LastAddr = TileAddr;
    }

    LeaveCriticalSection(&TTLock);
    return MapType;
}